

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::EmplaceBack<absl::lts_20250127::status_internal::Payload>
          (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Payload *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_> pVVar2;
  ulong uVar3;
  pointer pcVar4;
  undefined8 uVar5;
  CordRep *pCVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar10;
  move_iterator<absl::lts_20250127::status_internal::Payload_*> mVar11;
  Payload *__p;
  size_type __n;
  Payload *pPVar12;
  bool bVar13;
  Payload *pPStack_58;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> SStack_50;
  ulong uStack_40;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  IStack_38;
  
  uVar3 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  uVar9 = 1;
  if ((uVar3 & 1) != 0) {
    uVar9 = (this->data_).allocated.allocated_capacity;
  }
  uVar7 = uVar3 >> 1;
  if (uVar7 == uVar9) {
    uVar3 = (this->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    bVar13 = (uVar3 & 1) != 0;
    mVar11._M_current = (Payload *)&this->data_;
    if (bVar13) {
      mVar11._M_current = (this->data_).allocated.allocated_data;
    }
    pPStack_58 = (Payload *)0x0;
    SStack_50 = 0;
    __n = 2;
    if (bVar13) {
      __n = (this->data_).allocated.allocated_capacity * 2;
    }
    IStack_38.it_._M_current =
         (move_iterator<absl::lts_20250127::status_internal::Payload_*>)
         (move_iterator<absl::lts_20250127::status_internal::Payload_*>)mVar11._M_current;
    pPStack_58 = __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::allocate
                           ((new_allocator<absl::lts_20250127::status_internal::Payload> *)
                            &pPStack_58,__n,(void *)0x0);
    uVar9 = uVar3 >> 1;
    paVar8 = &pPStack_58[uVar9].type_url.field_2;
    pPVar12 = pPStack_58 + uVar9;
    pPStack_58[uVar9].type_url._M_dataplus._M_p = (pointer)paVar8;
    pcVar4 = (args->type_url)._M_dataplus._M_p;
    paVar1 = &(args->type_url).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      uVar5 = *(undefined8 *)((long)&(args->type_url).field_2 + 8);
      paVar8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&pPStack_58[uVar9].type_url.field_2 + 8) = uVar5;
    }
    else {
      (pPVar12->type_url)._M_dataplus._M_p = pcVar4;
      (pPVar12->type_url).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    (pPVar12->type_url)._M_string_length = (args->type_url)._M_string_length;
    (args->type_url)._M_dataplus._M_p = (pointer)paVar1;
    (args->type_url)._M_string_length = 0;
    (args->type_url).field_2._M_local_buf[0] = '\0';
    pCVar6 = (args->payload).contents_.data_.rep_.field_0.as_tree.rep;
    (pPVar12->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
         (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
    (pPVar12->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar6;
    (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
    (args->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    SStack_50 = __n;
    uStack_40 = uVar3;
    ConstructElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,std::move_iterator<absl::lts_20250127::status_internal::Payload*>>>
              ((type_identity_t<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)
               this,pPStack_58,&IStack_38,uVar9);
    if (1 < uStack_40) {
      __p = mVar11._M_current + (uVar9 - 1);
      do {
        __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::
        destroy<absl::lts_20250127::status_internal::Payload>
                  ((new_allocator<absl::lts_20250127::status_internal::Payload> *)this,__p);
        __p = __p + -1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    if (((this->metadata_).
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value & 1) != 0) {
      operator_delete((this->data_).allocated.allocated_data,
                      (this->data_).allocated.allocated_capacity * 0x30);
    }
    (this->data_).allocated.allocated_data = pPStack_58;
    (this->data_).allocated.allocated_capacity = SStack_50;
    (this->metadata_).
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         ((this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value | 1) + 2;
    return pPVar12;
  }
  if ((uVar3 & 1) == 0) {
    pPVar10 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&this->data_;
  }
  else {
    pPVar10 = (this->data_).allocated.allocated_data;
  }
  pVVar2 = pPVar10 + uVar7;
  pPVar10 = pPVar10 + uVar7;
  paVar8 = &(pPVar10->type_url).field_2;
  (pPVar10->type_url)._M_dataplus._M_p = (pointer)paVar8;
  pcVar4 = (args->type_url)._M_dataplus._M_p;
  paVar1 = &(args->type_url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&(args->type_url).field_2 + 8);
    paVar8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pPVar10->type_url).field_2 + 8) = uVar5;
  }
  else {
    (pVVar2->type_url)._M_dataplus._M_p = pcVar4;
    (pVVar2->type_url).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pVVar2->type_url)._M_string_length = (args->type_url)._M_string_length;
  (args->type_url)._M_dataplus._M_p = (pointer)paVar1;
  (args->type_url)._M_string_length = 0;
  (args->type_url).field_2._M_local_buf[0] = '\0';
  pCVar6 = (args->payload).contents_.data_.rep_.field_0.as_tree.rep;
  (pVVar2->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
  (pVVar2->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar6;
  (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (args->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  (this->metadata_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value =
       (this->metadata_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<unsigned_long,_1UL,_false>.value + 2;
  return pVVar2;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }